

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_gtest_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_gtest_tests::iu_SyntaxTest_x_iutest_x_LongDouble_Test::Body
          (iu_SyntaxTest_x_iutest_x_LongDouble_Test *this)

{
  Fixed *pFVar1;
  AssertionResult iutest_ar;
  AssertionResult local_1e8;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  iutest::internal::CmpHelperFloatingPointEQ<long_double>
            (&local_1e8,"1.0l","d",(longdouble)1,(longdouble)1);
  if (local_1e8.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,(longdouble)1);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xd4,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  else {
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_1e8,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,(longdouble)1);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xd6,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_1e8,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_1e8.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,(longdouble)1);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
                 ,0xd8,local_1e8.m_message._M_dataplus._M_p);
      local_1c0._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
      std::__cxx11::string::~string((string *)&local_1c0);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_1e8);
    iutest::internal::CmpHelperFloatingPointEQ<long_double>
              (&local_1e8,"1.0l","d",(longdouble)1,(longdouble)1);
    if (local_1e8.m_result != false) goto LAB_002ffac5;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    pFVar1 = iutest::AssertionHelper::Fixed::operator<<(&local_190,(longdouble)1);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_gtest_tests.cpp"
               ,0xda,local_1e8.m_message._M_dataplus._M_p);
    local_1c0._44_4_ = 0xfffffffd;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,pFVar1);
  }
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_002ffac5:
  std::__cxx11::string::~string((string *)&local_1e8);
  return;
}

Assistant:

TEST(SyntaxTest, LongDouble)
{
    if( long double d = 1.0l )
        ASSERT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        EXPECT_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        INFORM_LONG_DOUBLE_EQ(1.0l, d) << d;
    if( long double d = 1.0l )
        ASSUME_LONG_DOUBLE_EQ(1.0l, d) << d;
}